

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.cpp
# Opt level: O3

void __thiscall
CaDiCaL::External::push_external_clause_and_witness_on_extension_stack
          (External *this,vector<int,_std::allocator<int>_> *c,vector<int,_std::allocator<int>_> *w,
          uint64_t id)

{
  vector<int,_std::allocator<int>_> *this_00;
  uint *puVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  iterator iVar5;
  int *elit_1;
  uint *puVar6;
  int *elit;
  int local_3c;
  vector<int,_std::allocator<int>_> *local_38;
  
  this_00 = &this->extension;
  local_3c = 0;
  iVar5._M_current =
       (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = c;
  if (iVar5._M_current ==
      (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar5,&local_3c);
  }
  else {
    *iVar5._M_current = 0;
    (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current + 1;
  }
  puVar6 = (uint *)(w->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  puVar1 = (uint *)(w->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  if (puVar6 != puVar1) {
    do {
      uVar4 = *puVar6;
      uVar2 = -uVar4;
      if (0 < (int)uVar4) {
        uVar2 = uVar4;
      }
      init(this,(EVP_PKEY_CTX *)(ulong)uVar2);
      iVar5._M_current =
           (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)this_00,iVar5,(int *)puVar6);
        uVar4 = *puVar6;
      }
      else {
        uVar4 = *puVar6;
        *iVar5._M_current = uVar4;
        (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      mark(this,&this->witness,uVar4);
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  local_3c = 0;
  iVar5._M_current =
       (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  piVar3 = (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar5._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar5,&local_3c);
    iVar5._M_current =
         (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar3 = (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0;
    iVar5._M_current = iVar5._M_current + 1;
    (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current;
  }
  local_3c = 0;
  if (iVar5._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar5,&local_3c);
    iVar5._M_current =
         (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar3 = (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0;
    iVar5._M_current = iVar5._M_current + 1;
    (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current;
  }
  local_3c = (int)id;
  if (iVar5._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar5,&local_3c);
    iVar5._M_current =
         (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar3 = (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar5._M_current = local_3c;
    iVar5._M_current = iVar5._M_current + 1;
    (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current;
  }
  local_3c = 0;
  if (iVar5._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar5,&local_3c);
  }
  else {
    *iVar5._M_current = 0;
    (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current + 1;
  }
  puVar1 = (uint *)(local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar6 = (uint *)(local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    uVar4 = *puVar6;
    uVar2 = -uVar4;
    if (0 < (int)uVar4) {
      uVar2 = uVar4;
    }
    init(this,(EVP_PKEY_CTX *)(ulong)uVar2);
    iVar5._M_current =
         (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)this_00,iVar5,(int *)puVar6);
    }
    else {
      *iVar5._M_current = *puVar6;
      (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar5._M_current + 1;
    }
  }
  return;
}

Assistant:

void External::push_external_clause_and_witness_on_extension_stack (
    const vector<int> &c, const vector<int> &w, uint64_t id) {
  assert (id);
  extension.push_back (0);
  for (const auto &elit : w) {
    assert (elit != INT_MIN);
    init (abs (elit));
    extension.push_back (elit);
    mark (witness, elit);
  }
  extension.push_back (0);
  const uint32_t higher_bits = static_cast<int> (id << 32);
  const uint32_t lower_bits = (id & (((uint64_t) 1 << 32) - 1));
  extension.push_back (higher_bits);
  extension.push_back (lower_bits);
  extension.push_back (0);
  for (const auto &elit : c) {
    assert (elit != INT_MIN);
    init (abs (elit));
    extension.push_back (elit);
  }
}